

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O0

aiScene * aiImportFileFromMemoryWithProperties
                    (char *pBuffer,uint pLength,uint pFlags,char *pHint,aiPropertyStore *props)

{
  Importer *this;
  ImporterPimpl *pIVar1;
  aiScene *in;
  ScenePrivateData *pSVar2;
  char *pcVar3;
  ScenePrivateData *priv;
  ImporterPimpl *pimpl;
  PropertyMap *pp;
  Importer *imp;
  aiScene *scene;
  aiPropertyStore *props_local;
  char *pHint_local;
  uint pFlags_local;
  uint pLength_local;
  char *pBuffer_local;
  
  if (pBuffer == (char *)0x0) {
    __assert_fail("__null != pBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                  ,0xe4,
                  "const aiScene *aiImportFileFromMemoryWithProperties(const char *, unsigned int, unsigned int, const char *, const aiPropertyStore *)"
                 );
  }
  if (pLength == 0) {
    __assert_fail("0 != pLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/Assimp.cpp"
                  ,0xe5,
                  "const aiScene *aiImportFileFromMemoryWithProperties(const char *, unsigned int, unsigned int, const char *, const aiPropertyStore *)"
                 );
  }
  this = (Importer *)operator_new(8);
  Assimp::Importer::Importer(this);
  if (props != (aiPropertyStore *)0x0) {
    pIVar1 = Assimp::Importer::Pimpl(this);
    std::
    map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
    ::operator=(&pIVar1->mIntProperties,
                (map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
                 *)props);
    std::
    map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
    ::operator=(&pIVar1->mFloatProperties,
                (map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
                 *)(props + 0x30));
    std::
    map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=(&pIVar1->mStringProperties,
                (map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(props + 0x60));
    std::
    map<unsigned_int,_aiMatrix4x4t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
    ::operator=(&pIVar1->mMatrixProperties,
                (map<unsigned_int,_aiMatrix4x4t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiMatrix4x4t<float>_>_>_>
                 *)(props + 0x90));
  }
  in = Assimp::Importer::ReadFileFromMemory(this,pBuffer,(ulong)pLength,pFlags,pHint);
  if (in == (aiScene *)0x0) {
    pcVar3 = Assimp::Importer::GetErrorString(this);
    std::__cxx11::string::operator=((string *)Assimp::gLastErrorString_abi_cxx11_,pcVar3);
    if (this != (Importer *)0x0) {
      Assimp::Importer::~Importer(this);
      operator_delete(this,8);
    }
  }
  else {
    pSVar2 = Assimp::ScenePriv(in);
    pSVar2->mOrigImporter = this;
  }
  return in;
}

Assistant:

const aiScene* aiImportFileFromMemoryWithProperties(
    const char* pBuffer,
    unsigned int pLength,
    unsigned int pFlags,
    const char* pHint,
    const aiPropertyStore* props)
{
    ai_assert( NULL != pBuffer );
    ai_assert( 0 != pLength );

    const aiScene* scene = NULL;
    ASSIMP_BEGIN_EXCEPTION_REGION();

    // create an Importer for this file
    Assimp::Importer* imp = new Assimp::Importer();

    // copy properties
    if(props) {
        const PropertyMap* pp = reinterpret_cast<const PropertyMap*>(props);
        ImporterPimpl* pimpl = imp->Pimpl();
        pimpl->mIntProperties = pp->ints;
        pimpl->mFloatProperties = pp->floats;
        pimpl->mStringProperties = pp->strings;
        pimpl->mMatrixProperties = pp->matrices;
    }

    // and have it read the file from the memory buffer
    scene = imp->ReadFileFromMemory( pBuffer, pLength, pFlags,pHint);

    // if succeeded, store the importer in the scene and keep it alive
    if( scene)  {
         ScenePrivateData* priv = const_cast<ScenePrivateData*>( ScenePriv(scene) );
         priv->mOrigImporter = imp;
    }
    else    {
        // if failed, extract error code and destroy the import
        gLastErrorString = imp->GetErrorString();
        delete imp;
    }
    // return imported data. If the import failed the pointer is NULL anyways
    ASSIMP_END_EXCEPTION_REGION(const aiScene*);
    return scene;
}